

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall calculator::DivZeroException::~DivZeroException(DivZeroException *this)

{
  SyntaxError::~SyntaxError((SyntaxError *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DivZeroException(double x, int y) {
        error_msg = "Error: div zero/0 error: " + std::to_string(x) + "/" +
                    std::to_string(y);
    }